

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O0

void dump_mrd(void *mrdv)

{
  undefined4 *in_RDI;
  response_spec *mrd;
  
  switch(*in_RDI) {
  case 0:
    printf("Response Filter, code is %s\n",*(undefined8 *)(in_RDI + 4));
    break;
  case 1:
    printf("Response Transform, code is %s\n",*(undefined8 *)(in_RDI + 6));
    break;
  case 2:
    printf("Response Router, code is %s\n",*(undefined8 *)(in_RDI + 4));
    break;
  case 3:
    printf("Multityped Action, code is %s\n",*(undefined8 *)(in_RDI + 6));
  }
  return;
}

Assistant:

void
dump_mrd(void *mrdv)
{
    struct response_spec *mrd = (struct response_spec *) mrdv;
    switch (mrd->response_type) {
    case Response_Filter:
	printf("Response Filter, code is %s\n",
	       mrd->u.filter.function);
	break;
    case Response_Router:
	printf("Response Router, code is %s\n",
	       mrd->u.filter.function);
	break;
    case Response_Transform:
	printf("Response Transform, code is %s\n",
	       mrd->u.transform.function);
	break;
    case Response_Multityped:
	printf("Multityped Action, code is %s\n",
	       mrd->u.transform.function);
	break;
    }
}